

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O3

void spell_message(monster_conflict *mon,monster_spell *spell,_Bool seen,_Bool hits)

{
  ushort uVar1;
  monster_spell_level *pmVar2;
  monster_race *pmVar3;
  int iVar4;
  monster_spell_level *pmVar5;
  byte *pbVar6;
  ushort **ppuVar7;
  char *pcVar8;
  wchar_t mode;
  monster_altmsg *pmVar9;
  monster_conflict *pmVar10;
  wchar_t wVar11;
  ulong uVar12;
  char *fmt;
  byte *__s;
  byte bVar13;
  size_t end;
  char punct [8];
  char m_name [80];
  char buf [1024];
  size_t local_4a8;
  char local_4a0 [8];
  monster_conflict *local_498;
  monster_spell *local_490;
  char local_488 [80];
  char local_438 [1032];
  
  builtin_strncpy(local_4a0,".!?;:,\'",8);
  memset(local_438,0,0x400);
  local_4a8 = 0;
  pmVar2 = spell->level;
  do {
    pmVar5 = pmVar2;
    pmVar2 = pmVar5->next;
    if (pmVar2 == (monster_spell_level *)0x0) break;
  } while (pmVar2->power <= mon->race->spell_power);
  wVar11 = (mon->target).midx;
  if (wVar11 < L'\x01') {
    if (seen) {
      local_498 = (monster_conflict *)0x0;
      goto LAB_001836c3;
    }
  }
  else {
    local_498 = (monster_conflict *)cave_monster(cave,wVar11);
    if (seen) {
LAB_001836c3:
      pmVar3 = mon->race;
      uVar1 = spell->index;
      uVar12 = (ulong)uVar1;
      pmVar9 = pmVar3->spell_msgs;
      if (hits) {
        for (; pmVar9 != (monster_altmsg *)0x0; pmVar9 = pmVar9->next) {
          if ((pmVar9->index == uVar1) && (pmVar9->msg_type == MON_ALTMSG_SEEN)) {
            __s = (byte *)pmVar9->message;
            if (__s != (byte *)0x0) goto LAB_0018378c;
            break;
          }
        }
        __s = (byte *)pmVar5->message;
        if (__s != (byte *)0x0) goto LAB_001837a5;
        pcVar8 = pmVar3->name;
        fmt = "No message-vis for monster spell %d cast by %s.  Please report this bug.";
        goto LAB_00183aa0;
      }
      for (; pmVar9 != (monster_altmsg *)0x0; pmVar9 = pmVar9->next) {
        if ((pmVar9->index == uVar1) && (pmVar9->msg_type == MON_ALTMSG_MISS)) {
          __s = (byte *)pmVar9->message;
          if (__s != (byte *)0x0) goto LAB_0018378c;
          break;
        }
      }
      __s = (byte *)pmVar5->miss_message;
      if (__s == (byte *)0x0) {
        pcVar8 = pmVar3->name;
        fmt = "No message-miss for monster spell %d cast by %s.  Please report this bug.";
        goto LAB_00183aa0;
      }
      goto LAB_001837a5;
    }
    if (local_498 != (monster_conflict *)0x0) {
      return;
    }
  }
  uVar12 = (ulong)spell->index;
  for (pmVar9 = mon->race->spell_msgs; pmVar9 != (monster_altmsg *)0x0; pmVar9 = pmVar9->next) {
    if ((pmVar9->index == spell->index) && (pmVar9->msg_type == MON_ALTMSG_UNSEEN)) {
      __s = (byte *)pmVar9->message;
      if (__s != (byte *)0x0) {
        if (*__s == 0) {
          return;
        }
        goto LAB_0018374d;
      }
      break;
    }
  }
  __s = (byte *)pmVar5->blind_message;
  if (__s == (byte *)0x0) {
    pcVar8 = mon->race->name;
    fmt = "No message-invis for monster spell %d cast by %s.  Please report this bug.";
LAB_00183aa0:
    msg(fmt,uVar12,pcVar8);
    return;
  }
LAB_0018374d:
  local_498 = (monster_conflict *)0x0;
LAB_001837a5:
  local_490 = spell;
  pbVar6 = (byte *)strchr((char *)__s,0x7b);
  if (pbVar6 != (byte *)0x0) {
    wVar11 = (uint)(pbVar6 == __s) << 8 | 0x14;
    do {
      strnfcat(local_438,0x400,&local_4a8,"%.*s",(ulong)(uint)((int)pbVar6 - (int)__s),__s);
      __s = pbVar6 + 1;
      bVar13 = pbVar6[1];
      if (bVar13 != 0) {
        ppuVar7 = __ctype_b_loc();
        pbVar6 = pbVar6 + 2;
        do {
          if ((*(byte *)((long)*ppuVar7 + (ulong)bVar13 * 2 + 1) & 4) == 0) {
            if (bVar13 != 0x7d) break;
            iVar4 = strncmp((char *)__s,"name",4);
            pmVar10 = mon;
            if (iVar4 == 0) {
              pcVar8 = strchr(local_4a0,(int)(char)*pbVar6);
              mode = wVar11 | 0x200;
              if (pcVar8 != (char *)0x0) {
                mode = wVar11;
              }
LAB_001839ca:
              pcVar8 = local_488;
              monster_desc(pcVar8,0x50,(monster *)pmVar10,mode);
            }
            else {
              iVar4 = strncmp((char *)__s,"pronoun",7);
              if (iVar4 == 0) {
                mode = L'\"';
                goto LAB_001839ca;
              }
              iVar4 = strncmp((char *)__s,"target",6);
              if (iVar4 == 0) {
                if (L'\0' < (mon->target).midx) {
                  pcVar8 = strchr(local_4a0,(int)(char)*pbVar6);
                  pmVar10 = local_498;
                  mode = (uint)(pcVar8 == (char *)0x0) << 9 | 0x15;
                  goto LAB_001839ca;
                }
                strnfcat(local_438,0x400,&local_4a8,"you");
                __s = pbVar6;
                break;
              }
              iVar4 = strncmp((char *)__s,"type",4);
              if (iVar4 == 0) {
                pcVar8 = projections[mon->race->blow->effect->lash_type].lash_desc;
              }
              else {
                iVar4 = strncmp((char *)__s,"oftype",6);
                __s = pbVar6;
                if ((iVar4 != 0) ||
                   (pcVar8 = projections[mon->race->blow->effect->lash_type].lash_desc,
                   pcVar8 == (char *)0x0)) break;
                strnfcat(local_438,0x400,&local_4a8," of ");
              }
            }
            strnfcat(local_438,0x400,&local_4a8,"%s",pcVar8);
            __s = pbVar6;
            break;
          }
          bVar13 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while (bVar13 != 0);
      }
      pbVar6 = (byte *)strchr((char *)__s,0x7b);
      wVar11 = L'\x14';
    } while (pbVar6 != (byte *)0x0);
  }
  strnfcat(local_438,0x400,&local_4a8,"%s",__s);
  msgt(local_490->msgt,"%s",local_438);
  return;
LAB_0018378c:
  if (*__s == 0) {
    return;
  }
  goto LAB_001837a5;
}

Assistant:

static void spell_message(struct monster *mon,
						  const struct monster_spell *spell,
						  bool seen, bool hits)
{
	const char punct[] = ".!?;:,'";
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;
	struct monster_spell_level *level = spell->level;
	struct monster *t_mon = NULL;
	bool is_leading;

	/* Get the right level of message */
	while (level->next && mon->race->spell_power >= level->next->power) {
		level = level->next;
	}

	/* Get the target monster, if any */
	if (mon->target.midx > 0) {
		t_mon = cave_monster(cave, mon->target.midx);
	}

	/* Get the message */
	if (!seen) {
		if (t_mon) {
			return;
		} else {
			in_cursor = find_alternate_spell_message(mon->race,
				spell->index, MON_ALTMSG_UNSEEN);
			if (in_cursor == NULL) {
				in_cursor = level->blind_message;
				if (in_cursor == NULL) {
					msg("No message-invis for monster "
						"spell %d cast by %s.  "
						"Please report this bug.",
						(int)spell->index,
						mon->race->name);
					return;
				}
			} else if (in_cursor[0] == '\0') {
				return;
			}
		}
	} else if (!hits) {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_MISS);
		if (in_cursor == NULL) {
			in_cursor = level->miss_message;
			if (in_cursor == NULL) {
				msg("No message-miss for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	} else {
		in_cursor = find_alternate_spell_message(mon->race,
			spell->index, MON_ALTMSG_SEEN);
		if (in_cursor == NULL) {
			in_cursor = level->message;
			if (in_cursor == NULL) {
				msg("No message-vis for monster spell %d "
					"cast by %s.  Please report this bug.",
					(int)spell->index, mon->race->name);
				return;
			}
		} else if (in_cursor[0] == '\0') {
			return;
		}
	}

	next = strchr(in_cursor, '{');
	is_leading = (next == in_cursor);
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;

			switch (spell_tag_lookup(tag)) {
				case SPELL_TAG_NAME: {
					char m_name[80];
					int mdesc_mode = (MDESC_IND_HID |
						MDESC_PRO_HID);

					if (is_leading) {
						mdesc_mode |= MDESC_CAPITAL;
					}
					if (!strchr(punct, *in_cursor)) {
						mdesc_mode |= MDESC_COMMA;
					}
					monster_desc(m_name, sizeof(m_name),
						mon, mdesc_mode);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_name);
					break;
				}

				case SPELL_TAG_PRONOUN: {
					char m_poss[80];

					/* Get the monster possessive ("his"/"her"/"its") */
					monster_desc(m_poss, sizeof(m_poss), mon, MDESC_PRO_VIS | MDESC_POSS);

					strnfcat(buf, sizeof(buf), &end, "%s",
						m_poss);
					break;
				}

				case SPELL_TAG_TARGET: {
					char m_name[80];
					if (mon->target.midx > 0) {
						int mdesc_mode = MDESC_TARG;

						if (!strchr(punct, *in_cursor)) {
							mdesc_mode |= MDESC_COMMA;
						}
						monster_desc(m_name,
							sizeof(m_name), t_mon,
							mdesc_mode);
						strnfcat(buf, sizeof(buf), &end,
							"%s", m_name);
					} else {
						strnfcat(buf, sizeof(buf), &end, "you");
					}
					break;
				}

				case SPELL_TAG_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					strnfcat(buf, sizeof(buf), &end, "%s",
						type_name);
					break;
				}

				case SPELL_TAG_OF_TYPE: {
					/* Get the attack type (assuming lash) */
					int type = mon->race->blow[0].effect->lash_type;
					char *type_name = projections[type].lash_desc;

					if (type_name) {
						strnfcat(buf, sizeof(buf), &end, " of ");
						strnfcat(buf, sizeof(buf), &end,
							"%s", type_name);
					}
					break;
				}

				default: {
					break;
				}
			}
		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
		is_leading = false;
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msgt(spell->msgt, "%s", buf);
}